

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall Runtime::assignVar(Runtime *this,string *name,Data *data)

{
  _Fwd_list_node_base *p_Var1;
  _Self __tmp;
  VarEnv *this_00;
  
  p_Var1 = ((this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl.
            _M_head._M_next)->_M_next;
  if (p_Var1[1]._M_next == (_Fwd_list_node_base *)0x0) {
    this_00 = (VarEnv *)operator_new(0x30);
    VarEnv::VarEnv(this_00);
    p_Var1[1]._M_next = (_Fwd_list_node_base *)this_00;
  }
  VarEnv::assignVar((VarEnv *)p_Var1[1]._M_next,name,data);
  return;
}

Assistant:

void Runtime::assignVar(std::string &name, Data *data) {
    auto cursor = varEnvs.begin();
    cursor++;
    if (*cursor == NULL) {
        *cursor = new VarEnv();
    }
    (*cursor)->assignVar(name, data);
}